

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O3

void llvm::APInt::divide(WordType *LHS,uint lhsWords,WordType *RHS,uint rhsWords,WordType *Quotient,
                        WordType *Remainder)

{
  uint uVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  uint i;
  uint *__s;
  uint *__s_00;
  ulong uVar5;
  ulong uVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  uint uVar14;
  ulong uVar15;
  int iVar16;
  long lVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  ulong uVar23;
  uint32_t SPACE [128];
  uint *local_298;
  uint *local_290;
  uint local_238 [130];
  
  if (lhsWords < rhsWords) {
    __assert_fail("lhsWords >= rhsWords && \"Fractional result\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x581,
                  "static void llvm::APInt::divide(const WordType *, unsigned int, const WordType *, unsigned int, WordType *, WordType *)"
                 );
  }
  uVar21 = rhsWords * 2;
  uVar8 = lhsWords * 2;
  uVar20 = uVar8 + rhsWords * -2;
  uVar14 = lhsWords * 2 + 1;
  uVar11 = (ulong)uVar14;
  uVar5 = (ulong)uVar8;
  uVar22 = (ulong)uVar21;
  if ((4 - (uint)(Remainder == (WordType *)0x0)) * uVar21 + uVar20 * 2 + 1 < 0x81) {
    uVar14 = uVar21 + uVar14;
    __s_00 = local_238 + uVar11;
    local_298 = local_238 + uVar14;
    __s = local_238;
    if (Remainder == (WordType *)0x0) {
      local_290 = (uint *)0x0;
    }
    else {
      local_290 = local_238 + (uVar14 + uVar8);
    }
  }
  else {
    __s = (uint *)operator_new__(uVar11 * 4);
    __s_00 = (uint *)operator_new__(uVar22 * 4);
    local_298 = (uint *)operator_new__(uVar5 * 4);
    if (Remainder == (WordType *)0x0) {
      local_290 = (uint *)0x0;
    }
    else {
      local_290 = (uint *)operator_new__(uVar22 * 4);
    }
  }
  memset(__s,0,uVar11 << 2);
  if (lhsWords != 0) {
    uVar11 = 0;
    do {
      uVar2 = *(undefined8 *)((long)LHS + uVar11 * 4);
      __s[uVar11 & 0xffffffff] = (uint)uVar2;
      __s[(int)uVar11 + 1] = (uint)((ulong)uVar2 >> 0x20);
      uVar11 = uVar11 + 2;
    } while ((ulong)lhsWords * 2 != uVar11);
  }
  __s[uVar5] = 0;
  memset(__s_00,0,uVar22 * 4);
  if (rhsWords != 0) {
    uVar11 = 0;
    do {
      uVar2 = *(undefined8 *)((long)RHS + uVar11 * 4);
      __s_00[uVar11 & 0xffffffff] = (uint)uVar2;
      __s_00[(int)uVar11 + 1] = (uint)((ulong)uVar2 >> 0x20);
      uVar11 = uVar11 + 2;
    } while ((ulong)rhsWords * 2 != uVar11);
  }
  uVar11 = 0;
  memset(local_298,0,uVar5 << 2);
  if (Remainder != (WordType *)0x0) {
    memset(local_290,0,uVar22 * 4);
  }
  if (uVar21 != 0) {
    do {
      if (__s_00[uVar22 - 1] != 0) {
        uVar11 = uVar22 & 0xffffffff;
        uVar20 = uVar8 - (int)uVar22;
        break;
      }
      uVar22 = uVar22 - 1;
      uVar20 = uVar8;
    } while (uVar22 != 0);
  }
  iVar16 = (int)uVar11;
  uVar21 = uVar20;
  if (iVar16 + uVar20 != 0) {
    uVar5 = (ulong)(iVar16 + uVar20);
    do {
      uVar21 = uVar20;
      if (__s[uVar5 - 1] != 0) break;
      uVar5 = uVar5 - 1;
      uVar20 = uVar20 - 1;
      uVar21 = -iVar16;
    } while (uVar5 != 0);
  }
  if (iVar16 == 1) {
    if ((int)uVar21 < 0) {
      uVar21 = 0;
    }
    else {
      uVar8 = *__s_00;
      uVar5 = (ulong)uVar8;
      lVar17 = (ulong)uVar21 + 1;
      uVar11 = 0;
      do {
        uVar21 = __s[lVar17 + -1];
        uVar22 = (ulong)uVar21;
        uVar11 = uVar11 << 0x20 | uVar22;
        if (uVar11 == 0) {
          local_298[lVar17 + -1] = 0;
LAB_00145f20:
          uVar22 = 0;
        }
        else if (uVar11 < uVar5) {
          local_298[lVar17 + -1] = 0;
        }
        else {
          if (uVar11 == uVar5) {
            local_298[lVar17 + -1] = 1;
            goto LAB_00145f20;
          }
          uVar20 = (uint)(uVar11 / uVar5);
          local_298[lVar17 + -1] = uVar20;
          uVar22 = (ulong)(uVar21 - uVar20 * uVar8);
        }
        uVar21 = (uint)uVar22;
        lVar18 = lVar17 + -1;
        bVar3 = 0 < lVar17;
        lVar17 = lVar18;
        uVar11 = uVar22;
      } while (lVar18 != 0 && bVar3);
    }
    if (local_290 != (uint *)0x0) {
      *local_290 = uVar21;
    }
    goto LAB_001461ba;
  }
  if (iVar16 == 0) {
    __assert_fail("n != 0 && \"Divide by zero?\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x5c9,
                  "static void llvm::APInt::divide(const WordType *, unsigned int, const WordType *, unsigned int, WordType *, WordType *)"
                 );
  }
  if (((__s_00 == local_298) || (__s == __s_00)) || (__s == local_298)) {
    __assert_fail("u != v && u != q && v != q && \"Must use different memory\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                  ,0x4e0,
                  "void KnuthDiv(uint32_t *, uint32_t *, uint32_t *, uint32_t *, unsigned int, unsigned int)"
                 );
  }
  uVar20 = iVar16 - 1;
  uVar5 = (ulong)uVar20;
  uVar8 = __s_00[uVar5];
  if (uVar8 == 0) {
    uVar14 = 0x20;
  }
  else {
    uVar14 = 0x1f;
    if (uVar8 != 0) {
      for (; uVar8 >> uVar14 == 0; uVar14 = uVar14 - 1) {
      }
    }
    uVar14 = uVar14 ^ 0x1f;
  }
  uVar8 = uVar21 + iVar16;
  bVar7 = (byte)uVar14;
  if (uVar14 == 0) {
    uVar19 = 0;
  }
  else {
    uVar19 = 0;
    if (uVar8 != 0) {
      uVar22 = 0;
      uVar9 = 0;
      do {
        uVar19 = __s[uVar22] >> (0x20 - bVar7 & 0x1f);
        __s[uVar22] = __s[uVar22] << (bVar7 & 0x1f) | uVar9;
        uVar22 = uVar22 + 1;
        uVar9 = uVar19;
      } while (uVar8 != uVar22);
      if (iVar16 == 0) goto LAB_00145fd4;
    }
    uVar22 = 0;
    uVar9 = 0;
    do {
      uVar1 = __s_00[uVar22];
      __s_00[uVar22] = uVar1 << (bVar7 & 0x1f) | uVar9;
      uVar22 = uVar22 + 1;
      uVar9 = uVar1 >> (0x20 - bVar7 & 0x1f);
    } while (uVar11 != uVar22);
  }
LAB_00145fd4:
  __s[uVar8] = uVar19;
  lVar17 = (long)(int)uVar21;
  do {
    iVar4 = (int)lVar17;
    uVar21 = iVar16 + iVar4;
    uVar23 = (ulong)__s_00[uVar5];
    uVar22 = CONCAT44(__s[uVar21],__s[(iVar16 + iVar4) - 1]) / uVar23;
    uVar15 = CONCAT44(__s[uVar21],__s[(iVar16 + iVar4) - 1]) % uVar23;
    if ((uVar22 == 0x100000000) ||
       (uVar12 = (ulong)__s[uVar21 - 2] | uVar15 << 0x20, uVar6 = uVar22,
       uVar12 <= __s_00[iVar16 - 2U] * uVar22 && __s_00[iVar16 - 2U] * uVar22 - uVar12 != 0)) {
      uVar6 = uVar22 - 1;
      uVar15 = uVar15 + uVar23;
      if ((uVar15 >> 0x20 == 0) &&
         ((uVar6 == 0x100000000 ||
          (uVar15 = (ulong)__s[uVar21 - 2] | uVar15 << 0x20,
          uVar15 <= __s_00[iVar16 - 2U] * uVar6 && __s_00[iVar16 - 2U] * uVar6 - uVar15 != 0)))) {
        uVar6 = uVar22 - 2;
      }
    }
    uVar8 = (uint)uVar6;
    if (iVar16 == 0) {
      local_298[lVar17] = uVar8;
    }
    else {
      uVar22 = 0;
      uVar15 = 0;
      do {
        uVar19 = __s_00[uVar22];
        uVar9 = iVar4 + (int)uVar22;
        uVar15 = (ulong)__s[uVar9] - ((uVar19 * uVar6 & 0xffffffff) + uVar15);
        __s[uVar9] = (uint)uVar15;
        uVar15 = (uVar19 * uVar6 >> 0x20) - (uVar15 >> 0x20);
        uVar19 = (uint)uVar15;
        uVar15 = uVar15 & 0xffffffff;
        uVar22 = uVar22 + 1;
      } while (uVar11 != uVar22);
      uVar9 = __s[uVar21];
      __s[uVar21] = uVar9 - uVar19;
      local_298[lVar17] = uVar8;
      if (uVar9 < uVar19) {
        local_298[lVar17] = uVar8 - 1;
        uVar22 = 0;
        uVar8 = 0;
        do {
          uVar10 = iVar4 + (int)uVar22;
          uVar19 = __s_00[uVar22];
          uVar9 = __s[uVar10];
          uVar1 = uVar9;
          if (uVar19 < uVar9) {
            uVar1 = uVar19;
          }
          bVar13 = (byte)uVar8;
          uVar9 = uVar8 + uVar19 + uVar9;
          __s[uVar10] = uVar9;
          uVar8 = 1;
          if (uVar1 <= uVar9) {
            uVar8 = (uint)(bVar13 & uVar9 == uVar1);
          }
          uVar22 = uVar22 + 1;
        } while (uVar11 != uVar22);
        __s[uVar21] = __s[uVar21] + uVar8;
      }
    }
    bVar3 = 0 < lVar17;
    lVar17 = lVar17 + -1;
  } while (bVar3);
  if (local_290 != (uint *)0x0) {
    if (uVar14 == 0) {
      if (-1 < (int)uVar20) {
        lVar17 = uVar5 + 1;
        do {
          local_290[lVar17 + -1] = __s[lVar17 + -1];
          lVar18 = lVar17 + -1;
          bVar3 = 0 < lVar17;
          lVar17 = lVar18;
        } while (lVar18 != 0 && bVar3);
      }
    }
    else if (-1 < (int)uVar20) {
      lVar17 = uVar5 + 1;
      uVar21 = 0;
      do {
        uVar8 = __s[lVar17 + -1];
        local_290[lVar17 + -1] = uVar8 >> (bVar7 & 0x1f) | uVar21;
        lVar18 = lVar17 + -1;
        bVar3 = 0 < lVar17;
        lVar17 = lVar18;
        uVar21 = uVar8 << (0x20 - bVar7 & 0x1f);
      } while (lVar18 != 0 && bVar3);
    }
  }
LAB_001461ba:
  if (lhsWords != 0 && Quotient != (WordType *)0x0) {
    uVar11 = 0;
    do {
      *(ulong *)((long)Quotient + uVar11 * 4) =
           CONCAT44(local_298[(int)uVar11 + 1],local_298[uVar11 & 0xffffffff]);
      uVar11 = uVar11 + 2;
    } while ((ulong)lhsWords * 2 != uVar11);
  }
  if (rhsWords != 0 && Remainder != (WordType *)0x0) {
    uVar11 = 0;
    do {
      *(ulong *)((long)Remainder + uVar11 * 4) =
           CONCAT44(local_290[(int)uVar11 + 1],local_290[uVar11 & 0xffffffff]);
      uVar11 = uVar11 + 2;
    } while ((ulong)rhsWords * 2 != uVar11);
  }
  if (__s != local_238) {
    operator_delete__(__s);
    operator_delete__(__s_00);
    operator_delete__(local_298);
    if (local_290 != (uint *)0x0) {
      operator_delete__(local_290);
    }
  }
  return;
}

Assistant:

void APInt::divide(const WordType *LHS, unsigned lhsWords, const WordType *RHS,
                   unsigned rhsWords, WordType *Quotient, WordType *Remainder) {
  assert(lhsWords >= rhsWords && "Fractional result");

  // First, compose the values into an array of 32-bit words instead of
  // 64-bit words. This is a necessity of both the "short division" algorithm
  // and the Knuth "classical algorithm" which requires there to be native
  // operations for +, -, and * on an m bit value with an m*2 bit result. We
  // can't use 64-bit operands here because we don't have native results of
  // 128-bits. Furthermore, casting the 64-bit values to 32-bit values won't
  // work on large-endian machines.
  unsigned n = rhsWords * 2;
  unsigned m = (lhsWords * 2) - n;

  // Allocate space for the temporary values we need either on the stack, if
  // it will fit, or on the heap if it won't.
  uint32_t SPACE[128];
  uint32_t *U = nullptr;
  uint32_t *V = nullptr;
  uint32_t *Q = nullptr;
  uint32_t *R = nullptr;
  if ((Remainder?4:3)*n+2*m+1 <= 128) {
    U = &SPACE[0];
    V = &SPACE[m+n+1];
    Q = &SPACE[(m+n+1) + n];
    if (Remainder)
      R = &SPACE[(m+n+1) + n + (m+n)];
  } else {
    U = new uint32_t[m + n + 1];
    V = new uint32_t[n];
    Q = new uint32_t[m+n];
    if (Remainder)
      R = new uint32_t[n];
  }

  // Initialize the dividend
  memset(U, 0, (m+n+1)*sizeof(uint32_t));
  for (unsigned i = 0; i < lhsWords; ++i) {
    uint64_t tmp = LHS[i];
    U[i * 2] = Lo_32(tmp);
    U[i * 2 + 1] = Hi_32(tmp);
  }
  U[m+n] = 0; // this extra word is for "spill" in the Knuth algorithm.

  // Initialize the divisor
  memset(V, 0, (n)*sizeof(uint32_t));
  for (unsigned i = 0; i < rhsWords; ++i) {
    uint64_t tmp = RHS[i];
    V[i * 2] = Lo_32(tmp);
    V[i * 2 + 1] = Hi_32(tmp);
  }

  // initialize the quotient and remainder
  memset(Q, 0, (m+n) * sizeof(uint32_t));
  if (Remainder)
    memset(R, 0, n * sizeof(uint32_t));

  // Now, adjust m and n for the Knuth division. n is the number of words in
  // the divisor. m is the number of words by which the dividend exceeds the
  // divisor (i.e. m+n is the length of the dividend). These sizes must not
  // contain any zero words or the Knuth algorithm fails.
  for (unsigned i = n; i > 0 && V[i-1] == 0; i--) {
    n--;
    m++;
  }
  for (unsigned i = m+n; i > 0 && U[i-1] == 0; i--)
    m--;

  // If we're left with only a single word for the divisor, Knuth doesn't work
  // so we implement the short division algorithm here. This is much simpler
  // and faster because we are certain that we can divide a 64-bit quantity
  // by a 32-bit quantity at hardware speed and short division is simply a
  // series of such operations. This is just like doing short division but we
  // are using base 2^32 instead of base 10.
  assert(n != 0 && "Divide by zero?");
  if (n == 1) {
    uint32_t divisor = V[0];
    uint32_t remainder = 0;
    for (int i = m; i >= 0; i--) {
      uint64_t partial_dividend = Make_64(remainder, U[i]);
      if (partial_dividend == 0) {
        Q[i] = 0;
        remainder = 0;
      } else if (partial_dividend < divisor) {
        Q[i] = 0;
        remainder = Lo_32(partial_dividend);
      } else if (partial_dividend == divisor) {
        Q[i] = 1;
        remainder = 0;
      } else {
        Q[i] = Lo_32(partial_dividend / divisor);
        remainder = Lo_32(partial_dividend - (Q[i] * divisor));
      }
    }
    if (R)
      R[0] = remainder;
  } else {
    // Now we're ready to invoke the Knuth classical divide algorithm. In this
    // case n > 1.
    KnuthDiv(U, V, Q, R, m, n);
  }

  // If the caller wants the quotient
  if (Quotient) {
    for (unsigned i = 0; i < lhsWords; ++i)
      Quotient[i] = Make_64(Q[i*2+1], Q[i*2]);
  }

  // If the caller wants the remainder
  if (Remainder) {
    for (unsigned i = 0; i < rhsWords; ++i)
      Remainder[i] = Make_64(R[i*2+1], R[i*2]);
  }

  // Clean up the memory we allocated.
  if (U != &SPACE[0]) {
    delete [] U;
    delete [] V;
    delete [] Q;
    delete [] R;
  }
}